

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::ExtractScene(BlenderImporter *this,Scene *out,FileDatabase *file)

{
  ulong uVar1;
  pointer pSVar2;
  const_iterator cVar3;
  Logger *this_00;
  ostream *poVar4;
  undefined8 uVar5;
  FileBlockHead *bl;
  pointer pFVar6;
  char *local_1b0 [4];
  key_type local_190 [11];
  
  std::__cxx11::string::string((string *)local_190,"Scene",(allocator *)local_1b0);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(file->dna).indices._M_t,local_190);
  std::__cxx11::string::~string((string *)local_190);
  if ((_Rb_tree_header *)cVar3._M_node == &(file->dna).indices._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string
              ((string *)local_190,"There is no `Scene` structure record",(allocator *)local_1b0);
    LogFunctions<Assimp::BlenderImporter>::ThrowException(local_190);
    std::__cxx11::string::~string((string *)local_190);
  }
  uVar1 = *(ulong *)(cVar3._M_node + 2);
  pSVar2 = (file->dna).structures.
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar6 = (file->entries).
           super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           .
           super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pFVar6 == (file->entries).
                  super_vector<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                  .
                  super__Vector_base<Assimp::Blender::FileBlockHead,_std::allocator<Assimp::Blender::FileBlockHead>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string
                ((string *)local_190,"There is not a single `Scene` record to load",
                 (allocator *)local_1b0);
      LogFunctions<Assimp::BlenderImporter>::ThrowException(local_190);
      uVar5 = std::__cxx11::string::~string((string *)local_190);
      std::__cxx11::string::~string((string *)local_190);
      _Unwind_Resume(uVar5);
    }
    if (uVar1 == pFVar6->dna_index) break;
    pFVar6 = pFVar6 + 1;
  }
  StreamReader<true,_true>::SetCurrentPos
            ((file->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,(ulong)pFVar6->start);
  Blender::Structure::Convert<Assimp::Blender::Scene>(pSVar2 + uVar1,out,file);
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (char (*) [22])"(Stats) Fields read: ");
  poVar4 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_190
                      ,&(file->_stats).fields_read);
  std::operator<<(poVar4,", pointers resolved: ");
  poVar4 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar4,
                      &(file->_stats).pointers_resolved);
  std::operator<<(poVar4,", cache hits: ");
  poVar4 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar4,
                      &(file->_stats).cache_hits);
  std::operator<<(poVar4,", cached objects: ");
  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
            ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)poVar4,
             &(file->_stats).cached_objects);
  std::__cxx11::stringbuf::str();
  Logger::info(this_00,local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void BlenderImporter::ExtractScene(Scene& out, const FileDatabase& file)
{
    const FileBlockHead* block = NULL;
    std::map<std::string,size_t>::const_iterator it = file.dna.indices.find("Scene");
    if (it == file.dna.indices.end()) {
        ThrowException("There is no `Scene` structure record");
    }

    const Structure& ss = file.dna.structures[(*it).second];

    // we need a scene somewhere to start with.
    for(const FileBlockHead& bl :file.entries) {

        // Fix: using the DNA index is more reliable to locate scenes
        //if (bl.id == "SC") {

        if (bl.dna_index == (*it).second) {
            block = &bl;
            break;
        }
    }

    if (!block) {
        ThrowException("There is not a single `Scene` record to load");
    }

    file.reader->SetCurrentPos(block->start);
    ss.Convert(out,file);

#ifndef ASSIMP_BUILD_BLENDER_NO_STATS
    ASSIMP_LOG_INFO_F(
        "(Stats) Fields read: " ,file.stats().fields_read,
        ", pointers resolved: " ,file.stats().pointers_resolved,
        ", cache hits: "        ,file.stats().cache_hits,
        ", cached objects: "    ,file.stats().cached_objects
    );
#endif
}